

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

int test_then_block(LexState *ls)

{
  Token *pTVar1;
  SemInfo SVar2;
  undefined4 uVar3;
  int iVar4;
  
  iVar4 = (ls->lookahead).token;
  ls->lastline = ls->linenumber;
  if (iVar4 == 0x11f) {
    iVar4 = llex(ls,&(ls->t).seminfo);
    (ls->t).token = iVar4;
  }
  else {
    pTVar1 = &ls->lookahead;
    uVar3 = *(undefined4 *)&pTVar1->field_0x4;
    SVar2 = (ls->lookahead).seminfo;
    (ls->t).token = pTVar1->token;
    *(undefined4 *)&(ls->t).field_0x4 = uVar3;
    (ls->t).seminfo = SVar2;
    pTVar1->token = 0x11f;
  }
  iVar4 = cond(ls);
  checknext(ls,0x112);
  block(ls);
  return iVar4;
}

Assistant:

static int test_then_block(LexState*ls){
int condexit;
luaX_next(ls);
condexit=cond(ls);
checknext(ls,TK_THEN);
block(ls);
return condexit;
}